

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O2

int coda_cursor_read_float_partial_array
              (coda_cursor_conflict *cursor,long offset,long length,float *dst)

{
  int iVar1;
  double *dst_00;
  char *pcVar2;
  undefined8 uVar3;
  char *message;
  coda_type *type;
  long in_FS_OFFSET;
  coda_native_type read_type;
  coda_conversion *conversion;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (type = (coda_type *)cursor->stack[cursor->n - 1].type, type == (coda_type *)0x0)) {
    pcVar2 = "invalid cursor argument (%s:%u)";
    uVar3 = 0x13f1;
LAB_0010c0ca:
    coda_set_error(-100,pcVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,uVar3);
    return -1;
  }
  if (dst == (float *)0x0) {
    pcVar2 = "dst argument is NULL (%s:%u)";
    uVar3 = 0x13f6;
    goto LAB_0010c0ca;
  }
  if (99 < type->format) {
    type = *(coda_type **)&type->type_class;
  }
  if (type->type_class != coda_array_class) {
    pcVar2 = coda_type_get_class_name(type->type_class);
    message = "cursor does not refer to an array (current type is %s)";
LAB_0010c109:
    coda_set_error(-0x69,message,pcVar2);
    return -1;
  }
  if (*(int *)(in_FS_OFFSET + -0x1208) != 0) {
    iVar1 = coda_cursor_get_num_elements(cursor,(long *)&conversion);
    if (iVar1 != 0) {
      return -1;
    }
    if (offset < 0 || (long)conversion <= offset) {
      coda_set_error(-0x6b,"array offset (%ld) exceeds array range [0:%ld)",offset,conversion);
      return -1;
    }
    if ((long)conversion < length + offset) {
      coda_set_error(-0x6b,"array offset (%ld) + length (%ld) exceeds array range [0:%ld)",offset,
                     length);
      return -1;
    }
  }
  get_array_element_unconverted_read_type(type,&read_type,&conversion);
  if (conversion != (coda_conversion *)0x0) {
    dst_00 = (double *)malloc(length * 8);
    if (dst_00 == (double *)0x0) goto LAB_0010c417;
    iVar1 = coda_cursor_read_double_partial_array(cursor,offset,length,dst_00);
    if (iVar1 == 0) {
      for (; 0 < length; length = length + -1) {
        dst[length + -1] = (float)dst_00[length + -1];
      }
      goto LAB_0010c188;
    }
    goto LAB_0010c165;
  }
  switch(read_type) {
  case coda_native_type_int8:
    iVar1 = read_int8_partial_array(cursor,offset,length,(int8_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    for (; 0 < length; length = length + -1) {
      dst[length + -1] = (float)(int)*(char *)((long)dst + length + -1);
    }
    return 0;
  case coda_native_type_uint8:
    iVar1 = read_uint8_partial_array(cursor,offset,length,(uint8_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    for (; 0 < length; length = length + -1) {
      dst[length + -1] = (float)*(byte *)((long)dst + length + -1);
    }
    break;
  case coda_native_type_int16:
    iVar1 = read_int16_partial_array(cursor,offset,length,(int16_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    for (; 0 < length; length = length + -1) {
      dst[length + -1] = (float)(int)*(short *)((long)dst + length * 2 + -2);
    }
    break;
  case coda_native_type_uint16:
    iVar1 = read_uint16_partial_array(cursor,offset,length,(uint16_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    for (; 0 < length; length = length + -1) {
      dst[length + -1] = (float)*(ushort *)((long)dst + length * 2 + -2);
    }
    break;
  case coda_native_type_int32:
    iVar1 = read_int32_partial_array(cursor,offset,length,(int32_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    for (; 0 < length; length = length + -1) {
      dst[length + -1] = (float)(int)dst[length + -1];
    }
    break;
  case coda_native_type_uint32:
    iVar1 = read_uint32_partial_array(cursor,offset,length,(uint32_t *)dst);
    if (iVar1 != 0) {
      return -1;
    }
    for (; 0 < length; length = length + -1) {
      dst[length + -1] = (float)(uint)dst[length + -1];
    }
    break;
  case coda_native_type_int64:
    dst_00 = (double *)malloc(length * 8);
    if (dst_00 == (double *)0x0) {
LAB_0010c417:
      coda_set_error(-1,"out of memory (could not allocate %lu bytes)",length * 8);
      return -1;
    }
    iVar1 = read_int64_partial_array(cursor,offset,length,(int64_t *)dst_00);
    if (iVar1 == 0) {
      for (; 0 < length; length = length + -1) {
        dst[length + -1] = (float)(long)dst_00[length + -1];
      }
LAB_0010c188:
      free(dst_00);
      return 0;
    }
    goto LAB_0010c165;
  case coda_native_type_uint64:
    dst_00 = (double *)malloc(length * 8);
    if (dst_00 == (double *)0x0) goto LAB_0010c417;
    iVar1 = read_uint64_partial_array(cursor,offset,length,(uint64_t *)dst_00);
    if (iVar1 == 0) {
      for (; 0 < length; length = length + -1) {
        dst[length + -1] = (float)(ulong)dst_00[length + -1];
      }
      goto LAB_0010c188;
    }
    goto LAB_0010c165;
  case coda_native_type_float:
    iVar1 = read_float_partial_array(cursor,offset,length,dst);
    if (iVar1 != 0) {
      return -1;
    }
    break;
  case coda_native_type_double:
    dst_00 = (double *)malloc(length * 8);
    if (dst_00 == (double *)0x0) goto LAB_0010c417;
    iVar1 = read_double_partial_array(cursor,offset,length,dst_00);
    if (iVar1 == 0) {
      for (; 0 < length; length = length + -1) {
        dst[length + -1] = (float)dst_00[length + -1];
      }
      goto LAB_0010c188;
    }
LAB_0010c165:
    free(dst_00);
    return -1;
  default:
    pcVar2 = coda_type_get_native_type_name(read_type);
    message = "can not read %s data using a float data type";
    goto LAB_0010c109;
  }
  return 0;
}

Assistant:

LIBCODA_API int coda_cursor_read_float_partial_array(const coda_cursor *cursor, long offset, long length, float *dst)
{
    coda_native_type read_type;
    coda_conversion *conversion;
    coda_type *type;
    long i;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    /* check the range for offset and length */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (offset < 0 || offset >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) exceeds array range [0:%ld)", offset,
                           num_elements);
            return -1;
        }
        if (offset + length > num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) + length (%ld) exceeds array range "
                           "[0:%ld)", offset, length, num_elements);
            return -1;
        }
    }

    if (get_array_element_unconverted_read_type(type, &read_type, &conversion) != 0)
    {
        return -1;
    }
    if (conversion != NULL)
    {
        double *array;

        /* let the conversion be performed by coda_cursor_read_double_array() and cast the result */
        array = malloc(length * sizeof(double));
        if (array == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                           length * sizeof(double));
            return -1;
        }
        if (coda_cursor_read_double_partial_array(cursor, offset, length, array) != 0)
        {
            free(array);
            return -1;
        }
        for (i = length - 1; i >= 0; i--)
        {
            dst[i] = (float)array[i];
        }
        free(array);
        return 0;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            if (read_int8_partial_array(cursor, offset, length, (int8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((int8_t *)dst)[i];
            }
            break;
        case coda_native_type_uint8:
            if (read_uint8_partial_array(cursor, offset, length, (uint8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((uint8_t *)dst)[i];
            }
            break;
        case coda_native_type_int16:
            if (read_int16_partial_array(cursor, offset, length, (int16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((int16_t *)dst)[i];
            }
            break;
        case coda_native_type_uint16:
            if (read_uint16_partial_array(cursor, offset, length, (uint16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((uint16_t *)dst)[i];
            }
            break;
        case coda_native_type_int32:
            if (read_int32_partial_array(cursor, offset, length, (int32_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((int32_t *)dst)[i];
            }
            break;
        case coda_native_type_uint32:
            if (read_uint32_partial_array(cursor, offset, length, (uint32_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((uint32_t *)dst)[i];
            }
            break;
        case coda_native_type_int64:
            {
                int64_t *array;

                array = malloc(length * sizeof(int64_t));
                if (array == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                                   length * sizeof(int64_t));
                    return -1;
                }
                if (read_int64_partial_array(cursor, offset, length, array) != 0)
                {
                    free(array);
                    return -1;
                }
                for (i = length - 1; i >= 0; i--)
                {
                    dst[i] = (float)array[i];
                }
                free(array);
            }
            break;
        case coda_native_type_uint64:
            {
                uint64_t *array;

                array = malloc(length * sizeof(uint64_t));
                if (array == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                                   length * sizeof(int64_t));
                    return -1;
                }
                if (read_uint64_partial_array(cursor, offset, length, array) != 0)
                {
                    free(array);
                    return -1;
                }
                for (i = length - 1; i >= 0; i--)
                {
                    dst[i] = (float)array[i];
                }
                free(array);
            }
            break;
        case coda_native_type_float:
            if (read_float_partial_array(cursor, offset, length, dst) != 0)
            {
                return -1;
            }
            break;
        case coda_native_type_double:
            {
                double *array;

                array = malloc(length * sizeof(double));
                if (array == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                                   length * sizeof(double));
                    return -1;
                }
                if (read_double_partial_array(cursor, offset, length, array) != 0)
                {
                    free(array);
                    return -1;
                }
                for (i = length - 1; i >= 0; i--)
                {
                    dst[i] = (float)array[i];
                }
                free(array);
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a float data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}